

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O1

DataModelConstructor __thiscall
Rml::Context::CreateDataModel(Context *this,String *name,DataTypeRegister *data_type_register)

{
  DataTypeRegister *this_00;
  tuple<Rml::DataModel_*,_std::default_delete<Rml::DataModel>_> this_01;
  pointer __p;
  pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
  result;
  __uniq_ptr_impl<Rml::DataModel,_std::default_delete<Rml::DataModel>_> local_58;
  DataModelConstructor local_50;
  pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
  local_40;
  
  if (data_type_register == (DataTypeRegister *)0x0) {
    if ((this->default_data_type_register)._M_t.
        super___uniq_ptr_impl<Rml::DataTypeRegister,_std::default_delete<Rml::DataTypeRegister>_>.
        _M_t.
        super__Tuple_impl<0UL,_Rml::DataTypeRegister_*,_std::default_delete<Rml::DataTypeRegister>_>
        .super__Head_base<0UL,_Rml::DataTypeRegister_*,_false>._M_head_impl ==
        (DataTypeRegister *)0x0) {
      this_00 = (DataTypeRegister *)operator_new(0x60);
      DataTypeRegister::DataTypeRegister(this_00);
      local_40.first.mKeyVals = (NodePtr)0x0;
      ::std::__uniq_ptr_impl<Rml::DataTypeRegister,_std::default_delete<Rml::DataTypeRegister>_>::
      reset((__uniq_ptr_impl<Rml::DataTypeRegister,_std::default_delete<Rml::DataTypeRegister>_> *)
            &this->default_data_type_register,this_00);
      ::std::unique_ptr<Rml::DataTypeRegister,_std::default_delete<Rml::DataTypeRegister>_>::
      ~unique_ptr((unique_ptr<Rml::DataTypeRegister,_std::default_delete<Rml::DataTypeRegister>_> *)
                  &local_40);
    }
    data_type_register =
         (this->default_data_type_register)._M_t.
         super___uniq_ptr_impl<Rml::DataTypeRegister,_std::default_delete<Rml::DataTypeRegister>_>.
         _M_t.
         super__Tuple_impl<0UL,_Rml::DataTypeRegister_*,_std::default_delete<Rml::DataTypeRegister>_>
         .super__Head_base<0UL,_Rml::DataTypeRegister_*,_false>._M_head_impl;
  }
  this_01.super__Tuple_impl<0UL,_Rml::DataModel_*,_std::default_delete<Rml::DataModel>_>.
  super__Head_base<0UL,_Rml::DataModel_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_Rml::DataModel_*,_std::default_delete<Rml::DataModel>_>)operator_new(0x108)
  ;
  DataModel::DataModel
            ((DataModel *)
             this_01.super__Tuple_impl<0UL,_Rml::DataModel_*,_std::default_delete<Rml::DataModel>_>.
             super__Head_base<0UL,_Rml::DataModel_*,_false>._M_head_impl,data_type_register);
  local_58._M_t.super__Tuple_impl<0UL,_Rml::DataModel_*,_std::default_delete<Rml::DataModel>_>.
  super__Head_base<0UL,_Rml::DataModel_*,_false>._M_head_impl =
       (tuple<Rml::DataModel_*,_std::default_delete<Rml::DataModel>_>)
       (tuple<Rml::DataModel_*,_std::default_delete<Rml::DataModel>_>)
       this_01.super__Tuple_impl<0UL,_Rml::DataModel_*,_std::default_delete<Rml::DataModel>_>.
       super__Head_base<0UL,_Rml::DataModel_*,_false>._M_head_impl;
  robin_hood::detail::
  Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::DataModel,std::default_delete<Rml::DataModel>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
  ::
  emplace<std::__cxx11::string_const&,std::unique_ptr<Rml::DataModel,std::default_delete<Rml::DataModel>>>
            (&local_40,
             (Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::DataModel,std::default_delete<Rml::DataModel>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
              *)&this->data_models,name,
             (unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_> *)&local_58);
  ::std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>::~unique_ptr
            ((unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_> *)&local_58);
  if (local_40.second == true) {
    DataModelConstructor::DataModelConstructor
              (&local_50,
               ((local_40.first.mKeyVals)->mData).second._M_t.
               super___uniq_ptr_impl<Rml::DataModel,_std::default_delete<Rml::DataModel>_>._M_t.
               super__Tuple_impl<0UL,_Rml::DataModel_*,_std::default_delete<Rml::DataModel>_>.
               super__Head_base<0UL,_Rml::DataModel_*,_false>._M_head_impl);
  }
  else {
    Log::Message(LT_ERROR,"Data model name \'%s\' already exists.",(name->_M_dataplus)._M_p);
    DataModelConstructor::DataModelConstructor(&local_50);
  }
  return local_50;
}

Assistant:

DataModelConstructor Context::CreateDataModel(const String& name, DataTypeRegister* data_type_register)
{
	if (!data_type_register)
	{
		if (!default_data_type_register)
			default_data_type_register = MakeUnique<DataTypeRegister>();
		data_type_register = default_data_type_register.get();
	}

	auto result = data_models.emplace(name, MakeUnique<DataModel>(data_type_register));
	bool inserted = result.second;
	if (inserted)
		return DataModelConstructor(result.first->second.get());

	Log::Message(Log::LT_ERROR, "Data model name '%s' already exists.", name.c_str());
	return DataModelConstructor();
}